

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusinternalfilters.cpp
# Opt level: O0

QVariantMap * operator+=(QVariantMap *lhs,QVariantMap *rhs)

{
  long lVar1;
  bool bVar2;
  QVariant *this;
  QVariantMap *in_RDI;
  long in_FS_OFFSET;
  QVariant *value;
  QString *key;
  QKeyValueRange<const_QMap<QString,_QVariant>_&> *__range1;
  const_key_value_iterator __end1;
  const_key_value_iterator __begin1;
  QKeyValueRange<const_QMap<QString,_QVariant>_&> *in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QString,_QVariant>::asKeyValueRange
            ((QMap<QString,_QVariant> *)in_stack_ffffffffffffff80._M_node);
  QtPrivate::QKeyValueRange<const_QMap<QString,_QVariant>_&>::begin(in_stack_ffffffffffffff78);
  QtPrivate::QKeyValueRange<const_QMap<QString,_QVariant>_&>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar2 = operator!=((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                        )in_stack_ffffffffffffff88._M_node,
                       (QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                        )in_stack_ffffffffffffff80._M_node);
    if (!bVar2) break;
    QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>::
    operator*((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
               *)in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff98 =
         std::get<0ul,QString_const&,QVariant_const&>
                   ((pair<const_QString_&,_const_QVariant_&> *)0x1a00e2);
    this = std::get<1ul,QString_const&,QVariant_const&>
                     ((pair<const_QString_&,_const_QVariant_&> *)0x1a0100);
    in_stack_ffffffffffffff88._M_node =
         (_Base_ptr)
         QMap<QString,_QVariant>::insert
                   ((QMap<QString,_QVariant> *)this,in_stack_ffffffffffffff88._M_node,
                    in_stack_ffffffffffffff80._M_node);
    QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>::
    operator++((QKeyValueIterator<const_QString_&,_const_QVariant_&,_QMap<QString,_QVariant>::const_iterator>
                *)in_stack_ffffffffffffff80._M_node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QVariantMap &operator+=(QVariantMap &lhs, const QVariantMap &rhs)
{
    for (const auto &[key, value] : rhs.asKeyValueRange())
        lhs.insert(key, value);
    return lhs;
}